

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_ne_fop_DDDD(DisasContext_conflict8 *dc,int rd,int rs1,int rs2,
                    _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_TCGv_i32_conflict8 *gen)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGv_i32 v;
  uintptr_t o;
  TCGTemp *local_38;
  long local_30;
  long local_28;
  
  tcg_ctx = dc->uc->tcg_ctx;
  v = *(TCGv_i32 *)((long)tcg_ctx->cpu_fpr + (ulong)(rd & 0x1eU | (rd & 1U) << 5) * 4);
  local_30 = (long)&tcg_ctx->pool_cur +
             *(long *)((long)tcg_ctx->cpu_fpr + (ulong)(rs1 & 0x1eU | (rs1 & 1U) << 5) * 4);
  local_28 = (long)&tcg_ctx->pool_cur +
             *(long *)((long)tcg_ctx->cpu_fpr + (ulong)(rs2 & 0x1eU | (rs2 & 1U) << 5) * 4);
  local_38 = (TCGTemp *)(v + (long)&tcg_ctx->pool_cur);
  tcg_gen_callN_sparc64(tcg_ctx,helper_pdist,local_38,3,&local_38);
  gen_store_fpr_D(dc,rd,v);
  return;
}

Assistant:

static inline void gen_ne_fop_DDDD(DisasContext *dc, int rd, int rs1, int rs2,
                           void (*gen)(TCGContext *, TCGv_i64, TCGv_i64, TCGv_i64, TCGv_i64))
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGv_i64 dst, src0, src1, src2;

    src1 = gen_load_fpr_D(dc, rs1);
    src2 = gen_load_fpr_D(dc, rs2);
    src0 = gen_load_fpr_D(dc, rd);
    dst = gen_dest_fpr_D(dc, rd);

    gen(tcg_ctx, dst, src0, src1, src2);

    gen_store_fpr_D(dc, rd, dst);
}